

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void __thiscall ExampleAppConsole::ExampleAppConsole(ExampleAppConsole *this)

{
  ImVector<const_char_*> *pIVar1;
  char **ppcVar2;
  char **ppcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  (this->Items).Size = 0;
  (this->Items).Capacity = 0;
  (this->Items).Data = (char **)0x0;
  (this->History).Size = 0;
  (this->History).Capacity = 0;
  (this->History).Data = (char **)0x0;
  pIVar1 = &this->Commands;
  (this->Commands).Size = 0;
  (this->Commands).Capacity = 0;
  (this->Commands).Data = (char **)0x0;
  ClearLog(this);
  memset(this,0,0x100);
  this->HistoryPos = -1;
  iVar5 = (this->Commands).Size;
  iVar6 = (this->Commands).Capacity;
  if (iVar5 == iVar6) {
    iVar5 = iVar5 + 1;
    if (iVar6 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar6 / 2 + iVar6;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar6 < iVar5) {
      ppcVar3 = (char **)ImGui::MemAlloc((long)iVar5 << 3);
      ppcVar2 = (this->Commands).Data;
      if (ppcVar2 != (char **)0x0) {
        memcpy(ppcVar3,ppcVar2,(long)pIVar1->Size << 3);
      }
      ImGui::MemFree((this->Commands).Data);
      (this->Commands).Data = ppcVar3;
      (this->Commands).Capacity = iVar5;
    }
  }
  (this->Commands).Data[(this->Commands).Size] = "HELP";
  iVar6 = (this->Commands).Size;
  iVar4 = (this->Commands).Capacity;
  iVar5 = iVar6 + 1;
  (this->Commands).Size = iVar5;
  if (iVar5 == iVar4) {
    iVar6 = iVar6 + 2;
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar4 < iVar6) {
      ppcVar3 = (char **)ImGui::MemAlloc((long)iVar6 << 3);
      ppcVar2 = (this->Commands).Data;
      if (ppcVar2 != (char **)0x0) {
        memcpy(ppcVar3,ppcVar2,(long)pIVar1->Size << 3);
      }
      ImGui::MemFree((this->Commands).Data);
      (this->Commands).Data = ppcVar3;
      (this->Commands).Capacity = iVar6;
    }
  }
  (this->Commands).Data[(this->Commands).Size] = "HISTORY";
  iVar6 = (this->Commands).Size;
  iVar4 = (this->Commands).Capacity;
  iVar5 = iVar6 + 1;
  (this->Commands).Size = iVar5;
  if (iVar5 == iVar4) {
    iVar6 = iVar6 + 2;
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar4 < iVar6) {
      ppcVar3 = (char **)ImGui::MemAlloc((long)iVar6 << 3);
      ppcVar2 = (this->Commands).Data;
      if (ppcVar2 != (char **)0x0) {
        memcpy(ppcVar3,ppcVar2,(long)pIVar1->Size << 3);
      }
      ImGui::MemFree((this->Commands).Data);
      (this->Commands).Data = ppcVar3;
      (this->Commands).Capacity = iVar6;
    }
  }
  (this->Commands).Data[(this->Commands).Size] = "CLEAR";
  iVar6 = (this->Commands).Size;
  iVar4 = (this->Commands).Capacity;
  iVar5 = iVar6 + 1;
  (this->Commands).Size = iVar5;
  if (iVar5 == iVar4) {
    iVar6 = iVar6 + 2;
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar4 < iVar6) {
      ppcVar3 = (char **)ImGui::MemAlloc((long)iVar6 << 3);
      ppcVar2 = (this->Commands).Data;
      if (ppcVar2 != (char **)0x0) {
        memcpy(ppcVar3,ppcVar2,(long)pIVar1->Size << 3);
      }
      ImGui::MemFree((this->Commands).Data);
      (this->Commands).Data = ppcVar3;
      (this->Commands).Capacity = iVar6;
    }
  }
  (this->Commands).Data[(this->Commands).Size] = "CLASSIFY";
  (this->Commands).Size = (this->Commands).Size + 1;
  AddLog(this,"Welcome to ImGui!");
  return;
}

Assistant:

ExampleAppConsole()
    {
        ClearLog();
        memset(InputBuf, 0, sizeof(InputBuf));
        HistoryPos = -1;
        Commands.push_back("HELP");
        Commands.push_back("HISTORY");
        Commands.push_back("CLEAR");
        Commands.push_back("CLASSIFY");  // "classify" is here to provide an example of "C"+[tab] completing to "CL" and displaying matches.
        AddLog("Welcome to ImGui!");
    }